

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_dump.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *dst;
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  undefined8 uVar5;
  FILE *pFVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *src;
  char *extraout_RDX_01;
  char *__src;
  int iVar10;
  char *pcVar11;
  size_t sStack_20f0;
  char *local_20e8;
  int local_20e0;
  opj_image_t *image;
  undefined8 local_20d0;
  undefined4 local_20c8;
  int local_20c4;
  opj_codestream_index_t *cstr_index;
  opj_codestream_info_v2_t *cstr_info;
  undefined8 local_20b0;
  undefined1 local_20a8;
  char *local_20a0;
  opj_option_t long_option [1];
  opj_dparameters_t parameters;
  
  image = (opj_image_t *)0x0;
  cstr_info = (opj_codestream_info_v2_t *)0x0;
  cstr_index = (opj_codestream_index_t *)0x0;
  opj_set_default_decoder_parameters(&parameters);
  long_option[0].flag = (int *)0x0;
  long_option[0].val = 0x79;
  long_option[0]._28_4_ = 0;
  long_option[0].name = "ImgDir";
  long_option[0].has_arg = 1;
  long_option[0]._12_4_ = 0;
  local_20b0 = 0x76683a663a6f3a69;
  local_20a8 = 0;
  pcVar11 = parameters.outfile;
  local_20e0 = 0x13;
  bVar1 = true;
  dst = parameters.infile;
  local_20e8 = (char *)0x0;
  local_20c4 = argc;
  do {
    iVar2 = opj_getopt_long(argc,argv,(char *)&local_20b0,long_option,0x20);
    pFVar6 = _stdout;
    __src = opj_optarg;
    switch(iVar2) {
    case 0x66:
      local_20e0 = atoi(opj_optarg);
      break;
    case 0x68:
      uVar5 = opj_version();
      fprintf(pFVar6,
              "\nThis is the opj_dump utility from the OpenJPEG project.\nIt dumps JPEG 2000 codestream info to stdout or a given file.\nIt has been compiled against openjp2 library v%s.\n\n"
              ,uVar5);
      fwrite("Parameters:\n",0xc,1,_stdout);
      fwrite("-----------\n",0xc,1,_stdout);
      fputc(10,_stdout);
      fwrite("  -ImgDir <directory>\n",0x16,1,_stdout);
      fwrite("\tImage file Directory path \n",0x1c,1,_stdout);
      fwrite("  -i <compressed file>\n",0x17,1,_stdout);
      fwrite("    REQUIRED only if an Input image directory not specified\n",0x3c,1,_stdout);
      fwrite("    Currently accepts J2K-files, JP2-files and JPT-files. The file type\n",0x48,1,
             _stdout);
      fwrite("    is identified based on its suffix.\n",0x27,1,_stdout);
      fwrite("  -o <output file>\n",0x13,1,_stdout);
      fwrite("    OPTIONAL\n",0xd,1,_stdout);
      fwrite("    Output file where file info will be dump.\n",0x2e,1,_stdout);
      fwrite("    By default it will be in the stdout.\n",0x29,1,_stdout);
      fwrite("  -v ",5,1,_stdout);
      fwrite("    OPTIONAL\n",0xd,1,_stdout);
      fwrite("    Enable informative messages\n",0x20,1,_stdout);
      fwrite("    By default verbose mode is off.\n",0x24,1,_stdout);
      fputc(10,_stdout);
      goto LAB_00103b3d;
    case 0x69:
      pFVar6 = fopen(opj_optarg,"rb");
      if (pFVar6 != (FILE *)0x0) {
        local_20c8 = 0;
        local_20d0 = 0;
        sVar4 = fread(&local_20d0,1,0xc,pFVar6);
        fclose(pFVar6);
        if (sVar4 == 0xc) {
          iVar3 = get_file_format(__src);
          src = extraout_RDX;
          iVar2 = 2;
          if (iVar3 != 2) {
            iVar2 = bcmp(&local_20d0,"",0xc);
            pcVar9 = ".jp2";
            iVar10 = 1;
            if (iVar2 != 0) {
              pcVar9 = ".jp2";
              if ((int)local_20d0 != 0xa870a0d) {
                iVar10 = 0;
                pcVar9 = ".j2k or .jpc or .j2c";
                if ((int)local_20d0 != 0x51ff4fff) goto LAB_00103cd9;
              }
            }
            src = extraout_RDX_00;
            iVar2 = iVar3;
            if (iVar10 != iVar3) {
              local_20a0 = pcVar9;
              sVar4 = strlen(__src);
              fputs("\n===========================================\n",_stderr);
              fprintf(_stderr,"The extension of this file is incorrect.\nFOUND %s. SHOULD BE %s\n",
                      __src + (sVar4 - 4),local_20a0);
              fputs("===========================================\n",_stderr);
              src = extraout_RDX_01;
              iVar2 = iVar10;
            }
          }
          parameters.decod_format = iVar2;
          iVar2 = opj_strcpy_s(dst,(size_t)__src,src);
          argc = local_20c4;
          goto joined_r0x00103893;
        }
      }
LAB_00103cd9:
      parameters.decod_format = -1;
      pcVar11 = 
      "[ERROR] Unknown input file format: %s \n        Known file formats are *.j2k, *.jp2, *.jpc or *.jpt\n"
      ;
LAB_00103d8d:
      fprintf(_stderr,pcVar11,__src);
      goto LAB_00103b3d;
    case 0x6f:
      iVar2 = opj_strcpy_s(pcVar11,(size_t)opj_optarg,
                           (char *)&switchD_0010376c::switchdataD_00111010);
joined_r0x00103893:
      if (iVar2 != 0) {
        pcVar11 = "[ERROR] Path is too long\n";
        sStack_20f0 = 0x19;
LAB_00103d11:
        fwrite(pcVar11,sStack_20f0,1,_stderr);
LAB_00103b3d:
        free(local_20e8);
        return 1;
      }
      break;
    default:
      if (iVar2 == 0x76) {
        parameters.m_verbose = 1;
        break;
      }
      if (iVar2 == -1) {
        if (bVar1) {
          if (parameters.infile[0] != '\0') {
            if ((parameters.outfile[0] != '\0') &&
               (pFVar6 = fopen(pcVar11,"w"), pFVar6 == (FILE *)0x0)) {
              fprintf(_stderr,"ERROR -> failed to open %s for writing\n",pcVar11);
              return 1;
            }
            fputc(10,_stderr);
            lVar7 = opj_stream_create_default_file_stream(dst,1);
            if (lVar7 == 0) {
              fprintf(_stderr,"ERROR -> failed to create the stream from the file %s\n",dst);
              return 1;
            }
            if (2 < (ulong)(uint)parameters.decod_format) {
              fwrite("skipping file..\n",0x10,1,_stderr);
              opj_stream_destroy(lVar7);
LAB_00103cbb:
              fclose(pFVar6);
              return 0;
            }
            lVar8 = opj_create_decompress
                              (*(undefined4 *)
                                (&DAT_001110b8 + (ulong)(uint)parameters.decod_format * 4));
            opj_set_info_handler(lVar8,info_callback,0);
            opj_set_warning_handler(lVar8,warning_callback,0);
            opj_set_error_handler(lVar8,error_callback,0);
            parameters.flags._0_1_ = (byte)parameters.flags | 2;
            iVar2 = opj_setup_decoder(lVar8);
            if (iVar2 == 0) {
              fwrite("ERROR -> opj_dump: failed to setup the decoder\n",0x2f,1,_stderr);
              opj_stream_destroy(lVar7);
              opj_destroy_codec(lVar8);
            }
            else {
              iVar2 = opj_read_header(lVar7,lVar8,&image);
              if (iVar2 != 0) {
                opj_dump_codec(lVar8,local_20e0,pFVar6);
                cstr_info = (opj_codestream_info_v2_t *)opj_get_cstr_info(lVar8);
                cstr_index = (opj_codestream_index_t *)opj_get_cstr_index(lVar8);
                opj_stream_destroy(lVar7);
                if (lVar8 != 0) {
                  opj_destroy_codec(lVar8);
                }
                opj_image_destroy(image);
                opj_destroy_cstr_index(&cstr_index);
                opj_destroy_cstr_info(&cstr_info);
                goto LAB_00103cbb;
              }
              fwrite("ERROR -> opj_dump: failed to read the header\n",0x2d,1,_stderr);
              opj_stream_destroy(lVar7);
              opj_destroy_codec(lVar8);
              opj_image_destroy(image);
            }
            fclose(pFVar6);
            return 1;
          }
          fwrite("[ERROR] Required parameter is missing\n",0x26,1,_stderr);
          fprintf(_stderr,"Example: %s -i image.j2k\n",*argv);
          __src = *argv;
          pcVar11 = "   Help: %s -h\n";
          goto LAB_00103d8d;
        }
        if (parameters.infile[0] == '\0') {
          fwrite("[ERROR] When -ImgDir is used, -OutFor <FORMAT> must be used.\n",0x3d,1,_stderr);
          pcVar11 = 
          "Only one format allowed.\nValid format are PGM, PPM, PNM, PGX, BMP, TIF, RAW and TGA.\n";
          sStack_20f0 = 0x55;
        }
        else {
          pcVar11 = "[ERROR] options -ImgDir and -i cannot be used together.\n";
          sStack_20f0 = 0x38;
        }
        goto LAB_00103d11;
      }
      if (iVar2 == 0x79) {
        sVar4 = strlen(opj_optarg);
        local_20e8 = (char *)malloc(sVar4 + 1);
        if (local_20e8 == (char *)0x0) {
          local_20e8 = (char *)0x0;
          goto LAB_00103b3d;
        }
        strcpy(local_20e8,__src);
        bVar1 = false;
        break;
      }
    case 0x67:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6e:
      fwrite("[WARNING] An invalid option has been ignored.\n",0x2e,1,_stderr);
    }
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
    FILE *fout = NULL;

    opj_dparameters_t parameters;           /* Decompression parameters */
    opj_image_t* image = NULL;                  /* Image structure */
    opj_codec_t* l_codec = NULL;                /* Handle to a decompressor */
    opj_stream_t *l_stream = NULL;              /* Stream */
    opj_codestream_info_v2_t* cstr_info = NULL;
    opj_codestream_index_t* cstr_index = NULL;

    OPJ_INT32 num_images, imageno;
    img_fol_t img_fol;
    dircnt_t *dirptr = NULL;

    /* Set decoding parameters to default values */
    opj_set_default_decoder_parameters(&parameters);

    /* Initialize img_fol */
    memset(&img_fol, 0, sizeof(img_fol_t));
    img_fol.flag = OPJ_IMG_INFO | OPJ_J2K_MH_INFO | OPJ_J2K_MH_IND;

    /* Parse input and get user encoding parameters */
    if (parse_cmdline_decoder(argc, argv, &parameters, &img_fol) == 1) {
        if (img_fol.imgdirpath) {
            free(img_fol.imgdirpath);
        }

        return EXIT_FAILURE;
    }

    /* Initialize reading of directory */
    if (img_fol.set_imgdir == 1) {
        int it_image;
        num_images = get_num_images(img_fol.imgdirpath);

        dirptr = (dircnt_t*)malloc(sizeof(dircnt_t));
        if (!dirptr) {
            return EXIT_FAILURE;
        }
        dirptr->filename_buf = (char*)malloc((size_t)num_images * OPJ_PATH_LEN * sizeof(
                char)); /* Stores at max 10 image file names*/
        if (!dirptr->filename_buf) {
            free(dirptr);
            return EXIT_FAILURE;
        }
        dirptr->filename = (char**) malloc((size_t)num_images * sizeof(char*));

        if (!dirptr->filename) {
            goto fails;
        }

        for (it_image = 0; it_image < num_images; it_image++) {
            dirptr->filename[it_image] = dirptr->filename_buf + it_image * OPJ_PATH_LEN;
        }

        if (load_images(dirptr, img_fol.imgdirpath) == 1) {
            goto fails;
        }

        if (num_images == 0) {
            fprintf(stdout, "Folder is empty\n");
            goto fails;
        }
    } else {
        num_images = 1;
    }

    /* Try to open for writing the output file if necessary */
    if (parameters.outfile[0] != 0) {
        fout = fopen(parameters.outfile, "w");
        if (!fout) {
            fprintf(stderr, "ERROR -> failed to open %s for writing\n", parameters.outfile);
            goto fails;
        }
    } else {
        fout = stdout;
    }

    /* Read the header of each image one by one */
    for (imageno = 0; imageno < num_images ; imageno++) {

        fprintf(stderr, "\n");

        if (img_fol.set_imgdir == 1) {
            if (get_next_file(imageno, dirptr, &img_fol, &parameters)) {
                fprintf(stderr, "skipping file...\n");
                continue;
            }
        }

        /* Read the input file and put it in memory */
        /* ---------------------------------------- */

        l_stream = opj_stream_create_default_file_stream(parameters.infile, 1);
        if (!l_stream) {
            fprintf(stderr, "ERROR -> failed to create the stream from the file %s\n",
                    parameters.infile);
            goto fails;
        }

        /* Read the JPEG2000 stream */
        /* ------------------------ */

        switch (parameters.decod_format) {
        case J2K_CFMT: { /* JPEG-2000 codestream */
            /* Get a decoder handle */
            l_codec = opj_create_decompress(OPJ_CODEC_J2K);
            break;
        }
        case JP2_CFMT: { /* JPEG 2000 compressed image data */
            /* Get a decoder handle */
            l_codec = opj_create_decompress(OPJ_CODEC_JP2);
            break;
        }
        case JPT_CFMT: { /* JPEG 2000, JPIP */
            /* Get a decoder handle */
            l_codec = opj_create_decompress(OPJ_CODEC_JPT);
            break;
        }
        default:
            fprintf(stderr, "skipping file..\n");
            opj_stream_destroy(l_stream);
            continue;
        }

        /* catch events using our callbacks and give a local context */
        opj_set_info_handler(l_codec, info_callback, 00);
        opj_set_warning_handler(l_codec, warning_callback, 00);
        opj_set_error_handler(l_codec, error_callback, 00);

        parameters.flags |= OPJ_DPARAMETERS_DUMP_FLAG;

        /* Setup the decoder decoding parameters using user parameters */
        if (!opj_setup_decoder(l_codec, &parameters)) {
            fprintf(stderr, "ERROR -> opj_dump: failed to setup the decoder\n");
            opj_stream_destroy(l_stream);
            opj_destroy_codec(l_codec);
            fclose(fout);
            goto fails;
        }

        /* Read the main header of the codestream and if necessary the JP2 boxes*/
        if (! opj_read_header(l_stream, l_codec, &image)) {
            fprintf(stderr, "ERROR -> opj_dump: failed to read the header\n");
            opj_stream_destroy(l_stream);
            opj_destroy_codec(l_codec);
            opj_image_destroy(image);
            fclose(fout);
            goto fails;
        }

        opj_dump_codec(l_codec, img_fol.flag, fout);

        cstr_info = opj_get_cstr_info(l_codec);

        cstr_index = opj_get_cstr_index(l_codec);

        /* close the byte stream */
        opj_stream_destroy(l_stream);

        /* free remaining structures */
        if (l_codec) {
            opj_destroy_codec(l_codec);
        }

        /* destroy the image header */
        opj_image_destroy(image);

        /* destroy the codestream index */
        opj_destroy_cstr_index(&cstr_index);

        /* destroy the codestream info */
        opj_destroy_cstr_info(&cstr_info);

    }

    /* Close the output file */
    fclose(fout);

    return EXIT_SUCCESS;

fails:
    if (dirptr) {
        if (dirptr->filename) {
            free(dirptr->filename);
        }
        if (dirptr->filename_buf) {
            free(dirptr->filename_buf);
        }
        free(dirptr);
    }
    return EXIT_FAILURE;
}